

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver3.c
# Opt level: O0

void act_var_decay(sat_solver3 *s)

{
  word wVar1;
  xdbl xVar2;
  double dVar3;
  double dVar4;
  sat_solver3 *s_local;
  
  if (s->VarActType == 0) {
    s->var_inc = (s->var_inc >> 4) + s->var_inc;
  }
  else if (s->VarActType == 1) {
    dVar3 = Abc_Word2Dbl(s->var_inc);
    dVar4 = Abc_Word2Dbl(s->var_decay);
    wVar1 = Abc_Dbl2Word(dVar3 * dVar4);
    s->var_inc = wVar1;
  }
  else {
    if (s->VarActType != 2) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver3.c"
                    ,399,"void act_var_decay(sat_solver3 *)");
    }
    xVar2 = Xdbl_Mul(s->var_inc,s->var_decay);
    s->var_inc = xVar2;
  }
  return;
}

Assistant:

static inline void act_var_decay(sat_solver3* s)    
{ 
    if ( s->VarActType == 0 )
        s->var_inc += (s->var_inc >>  4); 
    else if ( s->VarActType == 1 )
        s->var_inc = Abc_Dbl2Word( Abc_Word2Dbl(s->var_inc) * Abc_Word2Dbl(s->var_decay) );
    else if ( s->VarActType == 2 )
        s->var_inc = Xdbl_Mul(s->var_inc, s->var_decay); 
    else assert(0);
}